

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O0

void __thiscall OpenMD::DumpWriter::writeFrame(DumpWriter *this,ostream *os)

{
  SimInfo *pSVar1;
  bool bVar2;
  SnapshotManager *this_00;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  Atom *atom;
  int siteIndex;
  RigidBody *rb;
  int ioIndex;
  AtomIterator ai;
  IntegrableObjectIterator ii;
  MoleculeIterator mi;
  StuntDouble *sd;
  Molecule *mol;
  Snapshot *in_stack_000006b0;
  ostream *in_stack_000006b8;
  DumpWriter *in_stack_000006c0;
  int in_stack_000011c8;
  int in_stack_000011cc;
  StuntDouble *in_stack_000011d0;
  DumpWriter *in_stack_000011d8;
  StuntDouble *in_stack_00001470;
  DumpWriter *in_stack_00001478;
  string *in_stack_ffffffffffffff18;
  SimInfo *in_stack_ffffffffffffff20;
  string local_c0 [32];
  Atom *local_a0;
  int local_94;
  StuntDouble *local_90;
  string local_88 [32];
  int local_68;
  string local_58 [32];
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_38;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  StuntDouble *local_20;
  Molecule *local_18;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_38);
  std::operator<<((ostream *)local_10,"  <Snapshot>\n");
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  SnapshotManager::getCurrentSnapshot(this_00);
  writeFrameProperties(in_stack_000006c0,in_stack_000006b8,in_stack_000006b0);
  std::operator<<((ostream *)local_10,"    <StuntDoubles>\n");
  local_18 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffff20,(MoleculeIterator *)in_stack_ffffffffffffff18);
  while (local_18 != (Molecule *)0x0) {
    local_20 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_ffffffffffffff20,
                          (iterator *)in_stack_ffffffffffffff18);
    while (local_20 != (StuntDouble *)0x0) {
      in_stack_ffffffffffffff20 = local_10;
      prepareDumpLine_abi_cxx11_(in_stack_00001478,in_stack_00001470);
      std::operator<<((ostream *)in_stack_ffffffffffffff20,local_58);
      std::__cxx11::string::~string(local_58);
      local_20 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffff20,
                            (iterator *)in_stack_ffffffffffffff18);
    }
    local_18 = SimInfo::nextMolecule
                         (in_stack_ffffffffffffff20,(MoleculeIterator *)in_stack_ffffffffffffff18);
  }
  std::operator<<((ostream *)local_10,"    </StuntDoubles>\n");
  if ((*(byte *)((long)in_RDI + 0x57) & 1) != 0) {
    std::operator<<((ostream *)local_10,"    <SiteData>\n");
    local_18 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff20,(MoleculeIterator *)in_stack_ffffffffffffff18);
    while (local_18 != (Molecule *)0x0) {
      local_20 = Molecule::beginIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffff20,
                            (iterator *)in_stack_ffffffffffffff18);
      while (local_20 != (StuntDouble *)0x0) {
        local_68 = StuntDouble::getGlobalIntegrableObjectIndex(local_20);
        pSVar1 = local_10;
        in_stack_ffffffffffffff18 = local_88;
        prepareSiteLine_abi_cxx11_
                  (in_stack_000011d8,in_stack_000011d0,in_stack_000011cc,in_stack_000011c8);
        std::operator<<((ostream *)pSVar1,in_stack_ffffffffffffff18);
        std::__cxx11::string::~string(local_88);
        bVar2 = StuntDouble::isRigidBody(local_20);
        if (bVar2) {
          local_90 = local_20;
          local_94 = 0;
          local_a0 = RigidBody::beginAtom
                               ((RigidBody *)in_stack_ffffffffffffff20,
                                (iterator *)in_stack_ffffffffffffff18);
          while (pSVar1 = local_10, local_a0 != (Atom *)0x0) {
            prepareSiteLine_abi_cxx11_
                      (in_stack_000011d8,in_stack_000011d0,in_stack_000011cc,in_stack_000011c8);
            std::operator<<((ostream *)pSVar1,local_c0);
            std::__cxx11::string::~string(local_c0);
            local_94 = local_94 + 1;
            local_a0 = RigidBody::nextAtom((RigidBody *)in_stack_ffffffffffffff20,
                                           (iterator *)in_stack_ffffffffffffff18);
          }
        }
        local_20 = Molecule::nextIntegrableObject
                             ((Molecule *)in_stack_ffffffffffffff20,
                              (iterator *)in_stack_ffffffffffffff18);
      }
      local_18 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff20,(MoleculeIterator *)in_stack_ffffffffffffff18)
      ;
    }
    std::operator<<((ostream *)local_10,"    </SiteData>\n");
  }
  std::operator<<((ostream *)local_10,"  </Snapshot>\n");
  std::ostream::flush();
  std::ios::rdbuf();
  std::streambuf::pubsync();
  return;
}

Assistant:

void DumpWriter::writeFrame(std::ostream& os) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ii;
    RigidBody::AtomIterator ai;

#ifndef IS_MPI
    os << "  <Snapshot>\n";

    writeFrameProperties(os, info_->getSnapshotManager()->getCurrentSnapshot());

    os << "    <StuntDoubles>\n";
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        os << prepareDumpLine(sd);
      }
    }
    os << "    </StuntDoubles>\n";

    if (doSiteData_) {
      os << "    <SiteData>\n";
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          os << prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              os << prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }
      os << "    </SiteData>\n";
    }
    os << "  </Snapshot>\n";

    os.flush();
    os.rdbuf()->pubsync();
#else

    const int primaryNode = 0;
    int worldRank;
    int nProc;

    MPI_Comm_size(MPI_COMM_WORLD, &nProc);
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == primaryNode) {
      os << "  <Snapshot>\n";
      writeFrameProperties(os,
                           info_->getSnapshotManager()->getCurrentSnapshot());
      os << "    <StuntDoubles>\n";
    }

    // every node prepares the dump lines for integrable objects belong to
    // itself
    std::string buffer;
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        buffer += prepareDumpLine(sd);
      }
    }

    if (worldRank == primaryNode) {
      os << buffer;

      for (int i = 1; i < nProc; ++i) {
        // tell processor i to start sending us data:

        MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // receive the length of the string buffer that was
        // prepared by processor i:
        int recvLength;
        MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                 &istatus);

        // create a buffer to receive the data
        char* recvBuffer = new char[recvLength];
        if (recvBuffer == NULL) {
        } else {
          // receive the data:
          MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                   MPI_COMM_WORLD, &istatus);
          // send it to the file:
          os << recvBuffer;
          // get rid of the receive buffer:
          delete[] recvBuffer;
        }
      }
    } else {
      int sendBufferLength = buffer.size() + 1;
      int myturn           = 0;
      for (int i = 1; i < nProc; ++i) {
        // wait for the primary node to call our number:
        MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        if (myturn == worldRank) {
          // send the length of our buffer:

          MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                   MPI_COMM_WORLD);

          // send our buffer:
          MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                   primaryNode, 0, MPI_COMM_WORLD);
        }
      }
    }

    if (worldRank == primaryNode) { os << "    </StuntDoubles>\n"; }

    if (doSiteData_) {
      if (worldRank == primaryNode) { os << "    <SiteData>\n"; }
      buffer.clear();
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          buffer += prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              buffer += prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }

      if (worldRank == primaryNode) {
        os << buffer;

        for (int i = 1; i < nProc; ++i) {
          // tell processor i to start sending us data:
          MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

          // receive the length of the string buffer that was
          // prepared by processor i:
          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                   &istatus);

          // create a buffer to receive the data
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            // receive the data:
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                     MPI_COMM_WORLD, &istatus);
            // send it to the file:
            os << recvBuffer;
            // get rid of the receive buffer:
            delete[] recvBuffer;
          }
        }
      } else {
        int sendBufferLength = buffer.size() + 1;
        int myturn           = 0;
        for (int i = 1; i < nProc; ++i) {
          // wait for the primary node to call our number:
          MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
          if (myturn == worldRank) {
            // send the length of our buffer:
            MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                     MPI_COMM_WORLD);
            // send our buffer:
            MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                     primaryNode, 0, MPI_COMM_WORLD);
          }
        }
      }

      if (worldRank == primaryNode) { os << "    </SiteData>\n"; }
    }

    if (worldRank == primaryNode) {
      os << "  </Snapshot>\n";
      os.flush();
      os.rdbuf()->pubsync();
    }

#endif  // is_mpi
  }